

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptError * __thiscall
Js::JavascriptLibrary::CreateStackOverflowError(JavascriptLibrary *this)

{
  JavascriptError *pError;
  undefined1 local_28 [8];
  AutoAllowAllocationDuringHeapEnum autoAllowAllocationDuringHeapEnum;
  
  Memory::Recycler::AutoAllowAllocationDuringHeapEnum::AutoAllowAllocationDuringHeapEnum
            ((AutoAllowAllocationDuringHeapEnum *)local_28,this->recycler);
  pError = CreateError((((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                       super_ScriptContextBase).javascriptLibrary);
  JavascriptError::SetErrorMessage
            (pError,-0x7ff5ffe4,(PCWSTR)0x0,(this->super_JavascriptLibraryBase).scriptContext.ptr);
  Memory::AutoBooleanToggle::~AutoBooleanToggle((AutoBooleanToggle *)local_28);
  return pError;
}

Assistant:

JavascriptError* JavascriptLibrary::CreateStackOverflowError()
    {
#if DBG
        // If we are doing a heap enum, we need to be able to allocate the error object.
        Recycler::AutoAllowAllocationDuringHeapEnum autoAllowAllocationDuringHeapEnum(this->GetRecycler());
#endif

        JavascriptError* stackOverflowError = scriptContext->GetLibrary()->CreateError();
        JavascriptError::SetErrorMessage(stackOverflowError, VBSERR_OutOfStack, NULL, scriptContext);
        return stackOverflowError;
    }